

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

void x86ReserveLabels(uint count)

{
  uint count_local;
  
  FastVector<unsigned_char_*,_false,_false>::resize(&labels,count);
  return;
}

Assistant:

void x86ReserveLabels(unsigned int count)
{
	labels.resize(count);
}